

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

void __thiscall irr::core::string<char>::string(string<char> *this,double number)

{
  c8 tmpbuf [32];
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  snprintf(tmpbuf,0x20,"%0.6f");
  ::std::__cxx11::string::assign((char *)this);
  return;
}

Assistant:

explicit string(const double number)
	{
		c8 tmpbuf[32];
		snprintf_irr(tmpbuf, sizeof(tmpbuf), "%0.6f", number);
		str = tmpbuf;
	}